

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void get_with_index_address_mode
               (m68k_info *info,cs_m68k_op *op,uint instruction,uint size,_Bool is_pc)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  int iVar6;
  m68k_reg mVar7;
  uint uVar8;
  m68k_address_mode mVar9;
  ulong uVar10;
  int iVar11;
  char cVar12;
  uint uVar13;
  uint uVar14;
  
  uVar14 = info->pc;
  uVar4 = info->code_len;
  iVar6 = (int)info->baseAddress;
  uVar3 = info->address_mask;
  uVar10 = (ulong)(uVar3 & uVar14 - iVar6);
  cVar12 = (char)size;
  if (uVar4 < uVar10 + 2) {
    info->pc = uVar14 + 2;
    op->address_mode = M68K_AM_AREGI_INDEX_BASE_DISP;
    iVar6 = 9;
    uVar14 = 0xaaaa;
  }
  else {
    puVar5 = info->code;
    bVar1 = puVar5[uVar10];
    bVar2 = puVar5[uVar10 + 1];
    uVar13 = uVar14 + 2;
    info->pc = uVar13;
    op->address_mode = M68K_AM_AREGI_INDEX_BASE_DISP;
    if ((bVar1 & 1) != 0) {
      (op->mem).base_reg = M68K_REG_INVALID;
      (op->mem).index_reg = M68K_REG_INVALID;
      if ((bVar2 & 0x30) < 0x11) {
        uVar8 = 0;
      }
      else {
        if ((bVar2 & 0x30) == 0x30) {
          uVar8 = peek_imm_32(info);
          iVar11 = 6;
        }
        else {
          uVar10 = (ulong)(uVar3 & uVar13 - iVar6);
          uVar8 = 0xaaaa;
          iVar11 = 4;
          if (uVar10 + 2 <= uVar4) {
            uVar8 = (uint)(ushort)(*(ushort *)(puVar5 + uVar10) << 8 |
                                  *(ushort *)(puVar5 + uVar10) >> 8);
            iVar11 = 4;
          }
        }
        uVar13 = uVar14 + iVar11;
        info->pc = uVar13;
      }
      (op->mem).in_disp = uVar8;
      uVar14 = 0;
      if ((~bVar2 & 0x44) != 0 && 1 < (bVar2 & 3)) {
        if ((bVar2 & 3) == 3) {
          uVar14 = peek_imm_32(info);
          iVar6 = 4;
        }
        else {
          uVar10 = (ulong)(uVar3 & uVar13 - iVar6);
          uVar14 = 0xaaaa;
          iVar6 = 2;
          if (uVar10 + 2 <= uVar4) {
            uVar14 = (uint)(ushort)(*(ushort *)(puVar5 + uVar10) << 8 |
                                   *(ushort *)(puVar5 + uVar10) >> 8);
          }
        }
        info->pc = uVar13 + iVar6;
      }
      (op->mem).out_disp = uVar14;
      if (-1 < (char)bVar2) {
        mVar7 = M68K_REG_PC;
        if (cVar12 == '\0') {
          mVar7 = (instruction & 7) + M68K_REG_A0;
        }
        (op->mem).base_reg = mVar7;
      }
      if ((bVar2 & 0x40) == 0) {
        mVar7 = (bVar1 >> 4 & 7) + M68K_REG_A0;
        if (-1 < (char)bVar1) {
          mVar7 = (bVar1 >> 4) + M68K_REG_D0;
        }
        (op->mem).index_reg = mVar7;
        (op->mem).index_size = bVar1 >> 3 & 1;
        if ((bVar1 >> 1 & 3) != 0) {
          (op->mem).scale = (uint8_t)(1 << (bVar1 >> 1 & 3));
        }
      }
      if ((bVar2 & 7) - 1 < 3) {
        mVar9 = (size & 0xff) * 5 + M68K_AM_MEMI_PRE_INDEX;
      }
      else {
        if ((bVar2 & 7) < 5) {
          return;
        }
        mVar9 = (size & 0xff) * 5 + M68K_AM_MEMI_POST_INDEX;
      }
      op->address_mode = mVar9;
      return;
    }
    uVar14 = (uint)CONCAT11(bVar1,bVar2);
    iVar6 = (uint)(bVar1 >> 7) * 8 + 1;
  }
  (op->mem).index_reg = (uVar14 >> 0xc & 7) + iVar6;
  (op->mem).index_size = (byte)(uVar14 >> 0xb) & 1;
  if ((char)uVar14 == '\0') {
    if (cVar12 == '\0') {
      (op->mem).base_reg = (instruction & 7) + M68K_REG_A0;
    }
    else {
      (op->mem).base_reg = M68K_REG_PC;
      op->address_mode = M68K_AM_PCI_INDEX_BASE_DISP;
    }
  }
  else {
    mVar7 = M68K_REG_PC;
    if (cVar12 == '\0') {
      mVar7 = (instruction & 7) + M68K_REG_A0;
    }
    (op->mem).base_reg = mVar7;
    op->address_mode = (size & 0xff) * 5 + M68K_AM_AREGI_INDEX_8_BIT_DISP;
    (op->mem).disp = (short)(char)uVar14;
  }
  uVar14 = uVar14 >> 9 & 3;
  if (uVar14 != 0) {
    (op->mem).scale = (uint8_t)(1 << (sbyte)uVar14);
  }
  return;
}

Assistant:

static void get_with_index_address_mode(m68k_info *info, cs_m68k_op* op, uint instruction, uint size, bool is_pc)
{
	uint extension = read_imm_16(info);

	op->address_mode = M68K_AM_AREGI_INDEX_BASE_DISP;

	if (EXT_FULL(extension)) {
		uint preindex;
		uint postindex;

		op->mem.base_reg = M68K_REG_INVALID;
		op->mem.index_reg = M68K_REG_INVALID;

		/* Not sure how to deal with this?
		   if (EXT_EFFECTIVE_ZERO(extension)) {
		   strcpy(mode, "0");
		   break;
		   }
		 */

		op->mem.in_disp = EXT_BASE_DISPLACEMENT_PRESENT(extension) ? (EXT_BASE_DISPLACEMENT_LONG(extension) ? read_imm_32(info) : read_imm_16(info)) : 0;
		op->mem.out_disp = EXT_OUTER_DISPLACEMENT_PRESENT(extension) ? (EXT_OUTER_DISPLACEMENT_LONG(extension) ? read_imm_32(info) : read_imm_16(info)) : 0;

		if (EXT_BASE_REGISTER_PRESENT(extension)) {
			if (is_pc) {
				op->mem.base_reg = M68K_REG_PC;
			} else {
				op->mem.base_reg = M68K_REG_A0 + (instruction & 7);
			}
		}

		if (EXT_INDEX_REGISTER_PRESENT(extension)) {
			if (EXT_INDEX_AR(extension)) {
				op->mem.index_reg = M68K_REG_A0 + EXT_INDEX_REGISTER(extension);
			} else {
				op->mem.index_reg = M68K_REG_D0 + EXT_INDEX_REGISTER(extension);
			}

			op->mem.index_size = EXT_INDEX_LONG(extension) ? 1 : 0;

			if (EXT_INDEX_SCALE(extension)) {
				op->mem.scale = 1 << EXT_INDEX_SCALE(extension);
			}
		}

		preindex = (extension & 7) > 0 && (extension & 7) < 4;
		postindex = (extension & 7) > 4;

		if (preindex) {
			op->address_mode = is_pc ? M68K_AM_PC_MEMI_PRE_INDEX : M68K_AM_MEMI_PRE_INDEX;
		} else if (postindex) {
			op->address_mode = is_pc ? M68K_AM_PC_MEMI_POST_INDEX : M68K_AM_MEMI_POST_INDEX;
		}

		return;
	}

	op->mem.index_reg = (EXT_INDEX_AR(extension) ? M68K_REG_A0 : M68K_REG_D0) + EXT_INDEX_REGISTER(extension);
	op->mem.index_size = EXT_INDEX_LONG(extension) ? 1 : 0;

	if (EXT_8BIT_DISPLACEMENT(extension) == 0) {
		if (is_pc) {
			op->mem.base_reg = M68K_REG_PC;
			op->address_mode = M68K_AM_PCI_INDEX_BASE_DISP;
		} else {
			op->mem.base_reg = M68K_REG_A0 + (instruction & 7);
		}
	} else {
		if (is_pc) {
			op->mem.base_reg = M68K_REG_PC;
			op->address_mode = M68K_AM_PCI_INDEX_8_BIT_DISP;
		} else {
			op->mem.base_reg = M68K_REG_A0 + (instruction & 7);
			op->address_mode = M68K_AM_AREGI_INDEX_8_BIT_DISP;
		}

		op->mem.disp = (int8_t)(extension & 0xff);
	}

	if (EXT_INDEX_SCALE(extension)) {
		op->mem.scale = 1 << EXT_INDEX_SCALE(extension);
	}
}